

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLocalGenerator.cxx
# Opt level: O0

bool cmLocalGeneratorShortenObjectName(string *objName,size_type max_len)

{
  char *input;
  bool bVar1;
  string local_98 [48];
  string local_68 [32];
  undefined1 local_48 [8];
  string md5name;
  size_type pos;
  size_type max_len_local;
  string *objName_local;
  
  std::__cxx11::string::size();
  md5name.field_2._8_8_ = std::__cxx11::string::find((char)objName,0x2f);
  bVar1 = md5name.field_2._8_8_ != -1;
  if (bVar1) {
    std::__cxx11::string::substr((ulong)local_68,(ulong)objName);
    input = (char *)std::__cxx11::string::c_str();
    cmLocalGeneratorMD5_abi_cxx11_((string *)local_48,input);
    std::__cxx11::string::~string(local_68);
    std::__cxx11::string::substr((ulong)local_98,(ulong)objName);
    std::__cxx11::string::operator+=((string *)local_48,local_98);
    std::__cxx11::string::~string(local_98);
    std::__cxx11::string::operator=((string *)objName,(string *)local_48);
    std::__cxx11::string::~string((string *)local_48);
  }
  return bVar1;
}

Assistant:

static bool
cmLocalGeneratorShortenObjectName(std::string& objName,
                                  std::string::size_type max_len)
{
  // Replace the beginning of the path portion of the object name with
  // its own md5 sum.
  std::string::size_type pos = objName.find('/', objName.size()-max_len+32);
  if(pos != objName.npos)
    {
    std::string md5name = cmLocalGeneratorMD5(objName.substr(0, pos).c_str());
    md5name += objName.substr(pos);
    objName = md5name;

    // The object name is now short enough.
    return true;
    }
  else
    {
    // The object name could not be shortened enough.
    return false;
    }
}